

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O1

void SubRefTimestep(SstStream Stream,ssize_t Timestep,int SetLast)

{
  CPTimestepList p_Var1;
  undefined8 in_RAX;
  uint uVar2;
  
  for (p_Var1 = Stream->QueuedTimesteps; p_Var1 != (CPTimestepList)0x0; p_Var1 = p_Var1->Next) {
    if (p_Var1->Timestep == Timestep) {
      uVar2 = p_Var1->ReferenceCount - 1;
      p_Var1->ReferenceCount = uVar2;
      in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),p_Var1->PreciousTimestep);
      CP_verbose(Stream,TraceVerbose,
                 "SubRef : Writer-side Timestep %ld now has reference count %d, expired %d, precious %d\n"
                 ,p_Var1->Timestep,(ulong)uVar2,(ulong)(uint)p_Var1->Expired,in_RAX);
    }
  }
  return;
}

Assistant:

static void SubRefTimestep(SstStream Stream, ssize_t Timestep, int SetLast)
{
    CPTimestepList List;
    List = Stream->QueuedTimesteps;
    STREAM_ASSERT_LOCKED(Stream);
    while (List)
    {
        if (List->Timestep == Timestep)
        {
            List->ReferenceCount--;
            CP_verbose(Stream, TraceVerbose,
                       "SubRef : Writer-side Timestep %ld "
                       "now has reference count %d, expired %d, precious %d\n",
                       List->Timestep, List->ReferenceCount, List->Expired, List->PreciousTimestep);
        }
        List = List->Next;
    }
}